

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

string * jbcoin::Logs::scrub(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  
  lVar4 = std::__cxx11::string::find((char *)s,0x27903e,0);
  if (lVar4 != -1) {
    uVar5 = lVar4 + 8;
    uVar6 = s->_M_string_length - 1;
    if (lVar4 + 0x2bU <= uVar6) {
      uVar6 = lVar4 + 0x2bU;
    }
    if (uVar5 < uVar6) {
      do {
        (s->_M_dataplus)._M_p[uVar5] = '*';
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
Logs::scrub (std::string s)
{
    using namespace std;
    char const* secretToken = "\"secret\"";
    // Look for the first occurrence of "secret" in the string.
    size_t startingPosition = s.find (secretToken);
    if (startingPosition != string::npos)
    {
        // Found it, advance past the token.
        startingPosition += strlen (secretToken);
        // Replace the next 35 characters at most, without overwriting the end.
        size_t endingPosition = std::min (startingPosition + 35, s.size () - 1);
        for (size_t i = startingPosition; i < endingPosition; ++i)
            s [i] = '*';
    }
    return s;
}